

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::Separator(void)

{
  ImDrawList *this;
  ImGuiContext *pIVar1;
  bool bVar2;
  uint v;
  ImU32 col;
  ImGuiWindow *pIVar3;
  ImVec2 local_54;
  ImVec2 local_4c;
  ImVec2 local_44;
  ImVec2 local_3c;
  undefined1 local_34 [8];
  ImRect bb;
  float x2;
  float x1;
  ImGuiSeparatorFlags flags;
  ImGuiContext *g;
  ImGuiWindow *window;
  
  pIVar3 = GetCurrentWindow();
  pIVar1 = GImGui;
  if ((pIVar3->SkipItems & 1U) == 0) {
    v = 1;
    if ((pIVar3->DC).LayoutType == 1) {
      v = 2;
    }
    bVar2 = ImIsPowerOfTwo(v);
    if (!bVar2) {
      __assert_fail("ImIsPowerOfTwo((int)(flags & (ImGuiSeparatorFlags_Horizontal | ImGuiSeparatorFlags_Vertical)))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x30b4,"void ImGui::Separator()");
    }
    if ((v & 2) == 0) {
      if ((pIVar3->DC).ColumnsSet != (ImGuiColumnsSet *)0x0) {
        PopClipRect();
      }
      bb.Max.y = (pIVar3->Pos).x;
      bb.Max.x = (pIVar3->Pos).x + (pIVar3->Size).x;
      bVar2 = ImVector<ImGuiGroupData>::empty(&(pIVar3->DC).GroupStack);
      if (!bVar2) {
        bb.Max.y = (pIVar3->DC).IndentX + bb.Max.y;
      }
      ImVec2::ImVec2(&local_3c,bb.Max.y,(pIVar3->DC).CursorPos.y);
      ImVec2::ImVec2(&local_44,bb.Max.x,(pIVar3->DC).CursorPos.y + 1.0);
      ImRect::ImRect((ImRect *)local_34,&local_3c,&local_44);
      ImVec2::ImVec2(&local_4c,0.0,0.0);
      ItemSize(&local_4c,0.0);
      bVar2 = ItemAdd((ImRect *)local_34,0,(ImRect *)0x0);
      if (bVar2) {
        this = pIVar3->DrawList;
        ImVec2::ImVec2(&local_54,bb.Min.x,(float)local_34._4_4_);
        col = GetColorU32(0x1b,1.0);
        ImDrawList::AddLine(this,(ImVec2 *)local_34,&local_54,col,1.0);
        if ((pIVar1->LogEnabled & 1U) != 0) {
          LogRenderedText((ImVec2 *)0x0,"\n--------------------------------",(char *)0x0);
        }
        if ((pIVar3->DC).ColumnsSet != (ImGuiColumnsSet *)0x0) {
          PushColumnClipRect(-1);
          ((pIVar3->DC).ColumnsSet)->LineMinY = (pIVar3->DC).CursorPos.y;
        }
      }
      else if ((pIVar3->DC).ColumnsSet != (ImGuiColumnsSet *)0x0) {
        PushColumnClipRect(-1);
      }
    }
    else {
      VerticalSeparator();
    }
  }
  return;
}

Assistant:

void ImGui::Separator()
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;
    ImGuiContext& g = *GImGui;

    ImGuiSeparatorFlags flags = 0;
    if ((flags & (ImGuiSeparatorFlags_Horizontal | ImGuiSeparatorFlags_Vertical)) == 0)
        flags |= (window->DC.LayoutType == ImGuiLayoutType_Horizontal) ? ImGuiSeparatorFlags_Vertical : ImGuiSeparatorFlags_Horizontal;
    IM_ASSERT(ImIsPowerOfTwo((int)(flags & (ImGuiSeparatorFlags_Horizontal | ImGuiSeparatorFlags_Vertical))));   // Check that only 1 option is selected
    if (flags & ImGuiSeparatorFlags_Vertical)
    {
        VerticalSeparator();
        return;
    }

    // Horizontal Separator
    if (window->DC.ColumnsSet)
        PopClipRect();

    float x1 = window->Pos.x;
    float x2 = window->Pos.x + window->Size.x;
    if (!window->DC.GroupStack.empty())
        x1 += window->DC.IndentX;

    const ImRect bb(ImVec2(x1, window->DC.CursorPos.y), ImVec2(x2, window->DC.CursorPos.y+1.0f));
    ItemSize(ImVec2(0.0f, 0.0f)); // NB: we don't provide our width so that it doesn't get feed back into AutoFit, we don't provide height to not alter layout.
    if (!ItemAdd(bb, 0))
    {
        if (window->DC.ColumnsSet)
            PushColumnClipRect();
        return;
    }

    window->DrawList->AddLine(bb.Min, ImVec2(bb.Max.x,bb.Min.y), GetColorU32(ImGuiCol_Separator));

    if (g.LogEnabled)
            LogRenderedText(NULL, IM_NEWLINE "--------------------------------");

    if (window->DC.ColumnsSet)
    {
        PushColumnClipRect();
        window->DC.ColumnsSet->LineMinY = window->DC.CursorPos.y;
    }
}